

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O3

void __thiscall
slang::syntax::SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor>::
visitDefault<slang::syntax::UnaryConditionalDirectiveExpressionSyntax_const&>
          (SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *this,
          UnaryConditionalDirectiveExpressionSyntax *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  size_t sVar2;
  uint uVar3;
  Token token;
  
  sVar1 = SyntaxNode::getChildCount((SyntaxNode *)node);
  if (sVar1 != 0) {
    uVar3 = 1;
    sVar1 = 0;
    do {
      node_00 = SyntaxNode::childNode((SyntaxNode *)node,sVar1);
      if (node_00 == (SyntaxNode *)0x0) {
        token = SyntaxNode::childToken((SyntaxNode *)node,sVar1);
        if (token.info != (Info *)0x0) {
          parsing::anon_unknown_4::MetadataVisitor::visitToken((MetadataVisitor *)this,token);
        }
      }
      else {
        detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (node_00,(MetadataVisitor *)this);
      }
      sVar1 = (size_t)uVar3;
      sVar2 = SyntaxNode::getChildCount((SyntaxNode *)node);
      uVar3 = uVar3 + 1;
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }